

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O0

UINT8 Audio_Deinit(void)

{
  ADRV_INSTANCE *pAVar1;
  ADRV_INSTANCE *tempAIns;
  UINT32 curDev;
  
  if (isInit) {
    for (tempAIns._0_4_ = 0; (uint)tempAIns < runDevCount; tempAIns._0_4_ = (uint)tempAIns + 1) {
      pAVar1 = runDevices + (uint)tempAIns;
      if (pAVar1->ID != 0xffffffff) {
        (*pAVar1->drvStruct->Stop)(pAVar1->drvData);
        (*pAVar1->drvStruct->Destroy)(pAVar1->drvData);
        ADrvLst_Clear(&pAVar1->forwardDrvs);
      }
    }
    for (tempAIns._0_4_ = 0; (uint)tempAIns < audDrvCount; tempAIns._0_4_ = (uint)tempAIns + 1) {
      if ((audDrvLoaded[(uint)tempAIns].flags & 2) != 0) {
        (*(audDrvLoaded[(uint)tempAIns].drvStruct)->Deinit)();
      }
    }
    free(runDevices);
    runDevices = (ADRV_INSTANCE *)0x0;
    runDevCount = 0;
    free(audDrvLoaded);
    audDrvLoaded = (ADRV_LOAD *)0x0;
    audDrvCount = 0;
    isInit = false;
    tempAIns._7_1_ = '\0';
  }
  else {
    tempAIns._7_1_ = '\x18';
  }
  return tempAIns._7_1_;
}

Assistant:

UINT8 Audio_Deinit(void)
{
	UINT32 curDev;
	ADRV_INSTANCE* tempAIns;
	
	if (! isInit)
		return AERR_WASDONE;
	
	for (curDev = 0; curDev < runDevCount; curDev ++)
	{
		tempAIns = &runDevices[curDev];
		if (tempAIns->ID != ADID_UNUSED)
		{
			tempAIns->drvStruct->Stop(tempAIns->drvData);
			tempAIns->drvStruct->Destroy(tempAIns->drvData);
			ADrvLst_Clear(&tempAIns->forwardDrvs);
		}
	}
	for (curDev = 0; curDev < audDrvCount; curDev ++)
	{
		if (audDrvLoaded[curDev].flags & ADFLG_IS_INIT)
			audDrvLoaded[curDev].drvStruct->Deinit();
	}
	
	free(runDevices);	runDevices = NULL;
	runDevCount = 0;
	free(audDrvLoaded);	audDrvLoaded = NULL;
	audDrvCount = 0;
	
	isInit = false;
	return AERR_OK;
}